

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

void __thiscall ParamActive::registerTrial(ParamActive *this,Address *addr,int4 sz)

{
  spacetype sVar1;
  AddrSpace *this_00;
  reference this_01;
  ParamTrial local_50;
  int4 local_1c;
  Address *pAStack_18;
  int4 sz_local;
  Address *addr_local;
  ParamActive *this_local;
  
  local_1c = sz;
  pAStack_18 = addr;
  addr_local = (Address *)this;
  ParamTrial::ParamTrial(&local_50,addr,sz,this->slotbase);
  std::vector<ParamTrial,_std::allocator<ParamTrial>_>::push_back(&this->trial,&local_50);
  this_00 = Address::getSpace(pAStack_18);
  sVar1 = AddrSpace::getType(this_00);
  if (sVar1 != IPTR_SPACEBASE) {
    this_01 = std::vector<ParamTrial,_std::allocator<ParamTrial>_>::back(&this->trial);
    ParamTrial::markKilledByCall(this_01);
  }
  this->slotbase = this->slotbase + 1;
  return;
}

Assistant:

void ParamActive::registerTrial(const Address &addr,int4 sz)

{
  trial.push_back(ParamTrial(addr,sz,slotbase));
  // It would require too much work to calculate whether a specific data location is changed
  // by a subfunction, but a fairly strong assumption is that (unless it is explicitly saved) a
  // register may change and is thus unlikely to be used as a location for passing parameters.
  // However stack locations saving a parameter across a function call is a common construction
  // Since this all a heuristic for recovering parameters, we assume this rule is always true
  // to get an efficient test
  if (addr.getSpace()->getType() != IPTR_SPACEBASE)
    trial.back().markKilledByCall();
  slotbase += 1;
}